

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O1

void __thiscall
jbcoin::STValidation::STValidation
          (STValidation *this,uint256 *ledgerHash,time_point signTime,PublicKey *publicKey,
          bool isFull)

{
  atomic<int> *paVar1;
  ulong uVar2;
  Counter *pCVar3;
  ulong uVar4;
  undefined1 local_48 [24];
  undefined8 uStack_30;
  
  getFormat();
  STObject::STObject(&this->super_STObject,&getFormat::holder.format,(SField *)sfValidation);
  pCVar3 = CountedObject<jbcoin::STValidation>::getCounter();
  LOCK();
  paVar1 = &(pCVar3->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STValidation_002d8110;
  (this->mNodeID).pn[0] = 0;
  (this->mNodeID).pn[1] = 0;
  (this->mNodeID).pn[2] = 0;
  (this->mNodeID).pn[3] = 0;
  *(undefined8 *)((long)(this->mNodeID).pn + 0xd) = 0;
  (this->mSeen).__d.__r = (rep_conflict)signTime.__d.__r;
  local_48._0_8_ = *(undefined8 *)ledgerHash->pn;
  local_48._8_8_ = *(undefined8 *)(ledgerHash->pn + 2);
  local_48._16_8_ = *(undefined8 *)(ledgerHash->pn + 4);
  uStack_30 = *(undefined8 *)(ledgerHash->pn + 6);
  STObject::setFieldUsingSetValue<jbcoin::STBitString<256ul>,jbcoin::base_uint<256ul,void>>
            (&this->super_STObject,(SField *)sfLedgerHash,(base_uint<256UL,_void>)*&ledgerHash->pn);
  STObject::setFieldUsingSetValue<jbcoin::STInteger<unsigned_int>,unsigned_int>
            (&this->super_STObject,(SField *)sfSigningTime,(uint)signTime.__d.__r);
  local_48._0_8_ = publicKey->buf_;
  local_48._8_8_ = publicKey->size_;
  STObject::setFieldVL(&this->super_STObject,(SField *)sfSigningPubKey,(Slice *)local_48);
  calcNodeID((NodeID *)local_48,publicKey);
  (this->mNodeID).pn[4] = local_48._16_4_;
  *(undefined8 *)(this->mNodeID).pn = local_48._0_8_;
  *(undefined8 *)((this->mNodeID).pn + 2) = local_48._8_8_;
  if ((this->mNodeID).pn[0] == 0) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (uVar4 == 4) {
        uVar4 = 4;
        break;
      }
      uVar2 = uVar4 + 1;
    } while ((this->mNodeID).pn[uVar4 + 1] == 0);
    if (3 < uVar4) {
      __assert_fail("mNodeID.isNonZero ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STValidation.cpp"
                    ,0x3a,
                    "jbcoin::STValidation::STValidation(const uint256 &, NetClock::time_point, const PublicKey &, bool)"
                   );
    }
  }
  if (isFull) {
    STObject::setFlag(&this->super_STObject,1);
  }
  return;
}

Assistant:

STValidation::STValidation (
        uint256 const& ledgerHash,
        NetClock::time_point signTime,
        PublicKey const& publicKey,
        bool isFull)
    : STObject (getFormat (), sfValidation)
    , mSeen (signTime)
{
    // Does not sign
    setFieldH256 (sfLedgerHash, ledgerHash);
    setFieldU32 (sfSigningTime, signTime.time_since_epoch().count());

    setFieldVL (sfSigningPubKey, publicKey.slice());
    mNodeID = calcNodeID(publicKey);
    assert (mNodeID.isNonZero ());

    if (isFull)
        setFlag (kFullFlag);
}